

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvatiming.c
# Opt level: O0

void time_pwm_nv50(uint cnum)

{
  undefined1 auVar1 [16];
  uint32_t addr;
  uint32_t addr_00;
  uint32_t val;
  uint32_t uVar2;
  uint32_t uVar3;
  ptime_t pVar4;
  uint64_t td;
  timeval end;
  timeval start;
  uint32_t save1;
  uint32_t save0;
  uint32_t b;
  uint32_t a;
  int i;
  uint cnum_local;
  
  for (b = 0; (int)b < 2; b = b + 1) {
    addr = b * 8 + 0xe114;
    addr_00 = b * 8 + 0xe118;
    val = nva_rd32(cnum,addr);
    uVar2 = nva_rd32(cnum,addr_00);
    nva_wr32(cnum,addr,0x200000);
    nva_wr32(cnum,addr_00,0x80080000);
    do {
      uVar3 = nva_rd32(cnum,addr_00);
    } while ((uVar3 & 0x80000000) != 0);
    nva_wr32(cnum,addr_00,0x80080000);
    do {
      uVar3 = nva_rd32(cnum,addr_00);
    } while ((uVar3 & 0x80000000) != 0);
    gettimeofday((timeval *)&end.tv_usec,(__timezone_ptr_t)0x0);
    nva_wr32(cnum,addr_00,0x80080000);
    do {
      uVar3 = nva_rd32(cnum,addr_00);
    } while ((uVar3 & 0x80000000) != 0);
    gettimeofday((timeval *)&td,(__timezone_ptr_t)0x0);
    pVar4 = time_diff_us(stack0xffffffffffffffd0,_td);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pVar4;
    printf("PWM %d: %dHz\n",(ulong)b,
           (ulong)SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1e848000000)) / auVar1,0));
    nva_wr32(cnum,addr,val);
    nva_wr32(cnum,addr_00,uVar2 | 0x80000000);
  }
  return;
}

Assistant:

void time_pwm_nv50(unsigned int cnum)
{
	int i;
	for (i = 0; i < 2; i++) {
		uint32_t a = 0xe114 + i * 8;
		uint32_t b = a + 4;
		uint32_t save0 = nva_rd32(cnum, a);
		uint32_t save1 = nva_rd32(cnum, b);

		struct timeval start, end;

		nva_wr32(cnum, a, 0x200000);
		nva_wr32(cnum, b, 0x80080000);
		while (nva_rd32(cnum, b) & 0x80000000);
		nva_wr32(cnum, b, 0x80080000);
		while (nva_rd32(cnum, b) & 0x80000000);
		gettimeofday(&start, NULL);
		nva_wr32(cnum, b, 0x80080000);
		while (nva_rd32(cnum, b) & 0x80000000);
		gettimeofday(&end, NULL);
		uint64_t td = (time_diff_us(start, end));
		printf("PWM %d: %dHz\n", i, (int)(1000000ll * 0x200000 / td));
		nva_wr32(cnum, a, save0);
		nva_wr32(cnum, b, 0x80000000 | save1);
	}
}